

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::~CConsole(CConsole *this)

{
  CCommand *pCVar1;
  void *pvVar2;
  CHeap *this_00;
  void *p;
  FCommandCallback p_Var3;
  CCommand *p_00;
  
  (this->super_IConsole).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CConsole_0015d668;
  p_00 = this->m_pFirstCommand;
  while (p_00 != (CCommand *)0x0) {
    pCVar1 = p_00->m_pNext;
    p_Var3 = p_00->m_pfnCallback;
    p = p_00->m_pUserData;
    while (p_Var3 == Con_Chain) {
      p_Var3 = *(FCommandCallback *)((long)p + 8);
      pvVar2 = *(void **)((long)p + 0x10);
      mem_free(p);
      p = pvVar2;
    }
    mem_free(p_00);
    p_00 = pCVar1;
  }
  this_00 = this->m_pTempMapListHeap;
  if (this_00 != (CHeap *)0x0) {
    CHeap::~CHeap(this_00);
    operator_delete(this_00,8);
    this->m_pTempMapListHeap = (CHeap *)0x0;
  }
  CHeap::~CHeap(&(this->m_ExecutionQueue).m_Queue);
  CHeap::~CHeap(&this->m_TempCommands);
  return;
}

Assistant:

CConsole::~CConsole()
{
	CCommand *pCommand = m_pFirstCommand;
	while(pCommand)
	{
		CCommand *pNext = pCommand->m_pNext;

		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		while(pfnCallback == Con_Chain)
		{
			CChain *pChainInfo = static_cast<CChain *>(pUserData);
			pfnCallback = pChainInfo->m_pfnCallback;
			pUserData = pChainInfo->m_pCallbackUserData;
			mem_free(pChainInfo);
		}

		mem_free(pCommand);

		pCommand = pNext;
	}
	if(m_pTempMapListHeap)
	{
		delete m_pTempMapListHeap;
		m_pTempMapListHeap = 0;
	}
}